

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseaudio.cpp
# Opt level: O1

pa_stream * __thiscall
anon_unknown.dwarf_292481::PulseMainloop::connectStream
          (PulseMainloop *this,char *device_name,unique_lock<std::mutex> *plock,pa_context *context,
          pa_stream_flags_t flags,pa_buffer_attr *attr,pa_sample_spec *spec,pa_channel_map *chanmap,
          BackendType type)

{
  code *pcVar1;
  int iVar2;
  undefined4 uVar3;
  pa_stream *ppVar4;
  backend_exception *this_00;
  undefined8 uVar5;
  char *pcVar6;
  
  pcVar6 = "Capture Stream";
  if (type == Playback) {
    pcVar6 = "Playback Stream";
  }
  ppVar4 = (pa_stream *)(*(anonymous_namespace)::ppa_stream_new)(context,pcVar6,spec,chanmap);
  if (ppVar4 == (pa_stream *)0x0) {
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    pcVar1 = (anonymous_namespace)::ppa_strerror;
    uVar3 = (*(anonymous_namespace)::ppa_context_errno)(context);
    uVar5 = (*pcVar1)(uVar3);
    al::backend_exception::backend_exception(this_00,0xa005,"pa_stream_new() failed (%s)",uVar5);
  }
  else {
    (*(anonymous_namespace)::ppa_stream_set_state_callback)(ppVar4,streamStateCallbackC,this);
    if (type == Playback) {
      iVar2 = (*(anonymous_namespace)::ppa_stream_connect_playback)
                        (ppVar4,device_name,attr,flags,0,0);
    }
    else {
      iVar2 = (*(anonymous_namespace)::ppa_stream_connect_record)();
    }
    if (-1 < iVar2) {
      iVar2 = (*(anonymous_namespace)::ppa_stream_get_state)(ppVar4);
      if (iVar2 != 2) {
        do {
          if (iVar2 - 3U < 0xfffffffe) {
            uVar3 = (*(anonymous_namespace)::ppa_context_errno)(context);
            (*(anonymous_namespace)::ppa_stream_unref)(ppVar4);
            this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
            uVar5 = (*(anonymous_namespace)::ppa_strerror)(uVar3);
            al::backend_exception::backend_exception
                      (this_00,0xa004,"%s did not get ready (%s)",pcVar6,uVar5);
            goto LAB_001691d4;
          }
          std::condition_variable::wait((unique_lock *)&this->mCondVar);
          iVar2 = (*(anonymous_namespace)::ppa_stream_get_state)(ppVar4);
        } while (iVar2 != 2);
      }
      (*(anonymous_namespace)::ppa_stream_set_state_callback)(ppVar4,0,0);
      return ppVar4;
    }
    (*(anonymous_namespace)::ppa_stream_unref)(ppVar4);
    this_00 = (backend_exception *)__cxa_allocate_exception(0x30);
    uVar5 = (*(anonymous_namespace)::ppa_strerror)(iVar2);
    al::backend_exception::backend_exception(this_00,0xa004,"%s did not connect (%s)",pcVar6,uVar5);
  }
LAB_001691d4:
  __cxa_throw(this_00,&al::backend_exception::typeinfo,al::base_exception::~base_exception);
}

Assistant:

pa_stream *PulseMainloop::connectStream(const char *device_name,
    std::unique_lock<std::mutex> &plock, pa_context *context, pa_stream_flags_t flags,
    pa_buffer_attr *attr, pa_sample_spec *spec, pa_channel_map *chanmap, BackendType type)
{
    const char *stream_id{(type==BackendType::Playback) ? "Playback Stream" : "Capture Stream"};
    pa_stream *stream{pa_stream_new(context, stream_id, spec, chanmap)};
    if(!stream)
        throw al::backend_exception{ALC_OUT_OF_MEMORY, "pa_stream_new() failed (%s)",
            pa_strerror(pa_context_errno(context))};

    pa_stream_set_state_callback(stream, &streamStateCallbackC, this);

    int err{(type==BackendType::Playback) ?
        pa_stream_connect_playback(stream, device_name, attr, flags, nullptr, nullptr) :
        pa_stream_connect_record(stream, device_name, attr, flags)};
    if(err < 0)
    {
        pa_stream_unref(stream);
        throw al::backend_exception{ALC_INVALID_VALUE, "%s did not connect (%s)", stream_id,
            pa_strerror(err)};
    }

    pa_stream_state_t state;
    while((state=pa_stream_get_state(stream)) != PA_STREAM_READY)
    {
        if(!PA_STREAM_IS_GOOD(state))
        {
            err = pa_context_errno(context);
            pa_stream_unref(stream);
            throw al::backend_exception{ALC_INVALID_VALUE, "%s did not get ready (%s)", stream_id,
                pa_strerror(err)};
        }

        mCondVar.wait(plock);
    }
    pa_stream_set_state_callback(stream, nullptr, nullptr);

    return stream;
}